

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_AutoChain_Test::TestBody(SSLVersionTest_AutoChain_Test *this)

{
  UniquePtr<X509> *this_00;
  UniquePtr<SSL> *out_client;
  pointer pcVar1;
  undefined8 uVar2;
  internal iVar3;
  int iVar4;
  X509_STORE *pXVar5;
  stack_st_X509 *psVar6;
  char *in_R9;
  char *pcVar7;
  pointer *__ptr;
  pointer *__ptr_9;
  bool bVar8;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  UniquePtr<X509> intermediate;
  AssertHelper local_c0;
  internal local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  _Head_base<0UL,_x509_st_*,_false> local_a8;
  X509 *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ASN1_OCTET_STRING *local_48;
  _Head_base<0UL,_x509_st_*,_false> local_40;
  stack_st_DIST_POINT *local_38;
  
  GetChainTestCertificate();
  uVar2 = local_98._0_8_;
  this_00 = &(this->super_SSLVersionTest).cert_;
  local_98._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  std::__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter> *)this_00,(pointer)uVar2);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_98);
  bVar8 = (this->super_SSLVersionTest).cert_._M_t.
          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl == (x509_st *)0x0;
  local_b8[0] = (internal)!bVar8;
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar8) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_b8,(AssertionResult *)"cert_","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x110e,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_a8);
LAB_0018aec1:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((undefined1 *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((X509 *)local_a8._M_head_impl != (X509 *)0x0) {
      (*(code *)((X509_CINF *)(local_a8._M_head_impl)->cert_info)->serialNumber)();
    }
    if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0,local_b0);
    }
    return;
  }
  KeyFromPEM((anon_unknown_0 *)local_98,(anonymous_namespace)::GetChainTestKey()::kKeyPEM);
  uVar2 = local_98._0_8_;
  local_98._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)
             &(this->super_SSLVersionTest).key_,(pointer)uVar2);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)local_98);
  local_b8[0] = (internal)
                ((this->super_SSLVersionTest).key_._M_t.
                 super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl != (evp_pkey_st *)0x0);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_b8,(AssertionResult *)0x34d59a,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1110,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_a8);
    goto LAB_0018aec1;
  }
  GetChainTestIntermediate();
  local_b8[0] = (internal)((X509 *)local_40._M_head_impl != (X509 *)0x0);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_40._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,local_b8,(AssertionResult *)"intermediate","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1112,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
LAB_0018b10f:
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((X509 *)local_a8._M_head_impl != (X509 *)0x0) {
      (*(code *)((X509_CINF *)(local_a8._M_head_impl)->cert_info)->serialNumber)();
    }
  }
  else {
    local_b8[0] = (internal)
                  SSLVersionTest::UseCertAndKey
                            (&this->super_SSLVersionTest,
                             (this->super_SSLVersionTest).client_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_b8[0]) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,local_b8,(AssertionResult *)"UseCertAndKey(client_ctx_.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1114,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
      goto LAB_0018b10f;
    }
    local_b8[0] = (internal)
                  SSLVersionTest::UseCertAndKey
                            (&this->super_SSLVersionTest,
                             (this->super_SSLVersionTest).server_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_b8[0]) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,local_b8,(AssertionResult *)"UseCertAndKey(server_ctx_.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1115,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
      goto LAB_0018b10f;
    }
    pXVar5 = SSL_CTX_get_cert_store
                       ((SSL_CTX *)
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    iVar4 = X509_STORE_add_cert(pXVar5,(X509 *)local_40._M_head_impl);
    local_b8[0] = (internal)(iVar4 != 0);
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,local_b8,
                 (AssertionResult *)
                 "X509_STORE_add_cert(SSL_CTX_get_cert_store(client_ctx_.get()), intermediate.get())"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x111a,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
      goto LAB_0018b10f;
    }
    pXVar5 = SSL_CTX_get_cert_store
                       ((SSL_CTX *)
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    iVar4 = X509_STORE_add_cert(pXVar5,(X509 *)local_40._M_head_impl);
    local_b8[0] = (internal)(iVar4 != 0);
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,local_b8,
                 (AssertionResult *)
                 "X509_STORE_add_cert(SSL_CTX_get_cert_store(server_ctx_.get()), intermediate.get())"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x111c,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
      goto LAB_0018b10f;
    }
    SSL_CTX_set_verify((SSL_CTX *)
                       (this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3,(callback *)0x0);
    SSL_CTX_set_verify((SSL_CTX *)
                       (this->super_SSLVersionTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3,(callback *)0x0);
    SSL_CTX_set_cert_verify_callback
              ((SSL_CTX *)
               (this->super_SSLVersionTest).client_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,VerifySucceed,(void *)0x0);
    SSL_CTX_set_cert_verify_callback
              ((SSL_CTX *)
               (this->super_SSLVersionTest).server_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,VerifySucceed,(void *)0x0);
    pcVar1 = local_88 + 0x10;
    local_88._8_8_ = 0;
    local_88._24_8_ = 0;
    sStack_60 = 0;
    local_58._8_8_ = 0;
    local_98._0_8_ = (x509_st *)0x0;
    local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
    local_88._16_8_ = 0;
    local_58._M_allocated_capacity = 0;
    local_48 = (ASN1_OCTET_STRING *)0x0;
    out_client = &(this->super_SSLVersionTest).client_;
    local_38 = (stack_st_DIST_POINT *)&(this->super_SSLVersionTest).server_;
    bVar8 = (this->super_SSLVersionTest).shed_handshake_config_;
    pcVar7 = (char *)(ulong)bVar8;
    local_88._0_8_ = pcVar1;
    local_68._M_p = (pointer)&local_58;
    local_b8[0] = (internal)
                  ConnectClientAndServer
                            (out_client,(UniquePtr<SSL> *)local_38,
                             (this->super_SSLVersionTest).client_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             (this->super_SSLVersionTest).server_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             (ClientConfig *)local_98,bVar8);
    local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,local_b8,(AssertionResult *)"Connect()","false","true",pcVar7);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1127,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
    }
    else {
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      psVar6 = SSL_get_peer_full_cert_chain
                         ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      local_a8._M_head_impl =
           (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
      __l._M_len = 1;
      __l._M_array = &local_a8._M_head_impl;
      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l,
                 (allocator_type *)&local_c0);
      local_b8[0] = (internal)
                    ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
        if (!(bool)local_b8[0]) goto LAB_0018b1df;
      }
      else {
        operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
        if (((byte)local_b8[0] & 1) == 0) {
LAB_0018b1df:
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,local_b8,
                     (AssertionResult *)
                     "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get()})",
                     "false","true",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x112a,(char *)local_98._0_8_);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
          }
          if (local_a8._M_head_impl != (x509_st *)0x0) {
            (*(code *)(local_a8._M_head_impl)->cert_info->serialNumber)();
          }
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      psVar6 = SSL_get_peer_full_cert_chain
                         ((SSL *)*(__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true> *)
                                  local_38);
      local_a8._M_head_impl =
           (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
      __l_00._M_len = 1;
      __l_00._M_array = &local_a8._M_head_impl;
      std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_00,
                 (allocator_type *)&local_c0);
      local_b8[0] = (internal)
                    ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
        if (!(bool)local_b8[0]) goto LAB_0018b2fe;
      }
      else {
        operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
        if (((byte)local_b8[0] & 1) == 0) {
LAB_0018b2fe:
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,local_b8,
                     (AssertionResult *)
                     "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get()})",
                     "false","true",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x112c,(char *)local_98._0_8_);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
          }
          if ((X509 *)local_a8._M_head_impl != (X509 *)0x0) {
            (*(code *)((X509_CINF *)(local_a8._M_head_impl)->cert_info)->serialNumber)();
          }
        }
      }
      if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,local_b0);
      }
      SSL_CTX_clear_mode((this->super_SSLVersionTest).client_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,8);
      SSL_CTX_clear_mode((this->super_SSLVersionTest).server_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,8);
      local_88._8_8_ = 0;
      local_88._24_8_ = 0;
      sStack_60 = 0;
      local_58._8_8_ = 0;
      local_98._0_8_ = (x509_st *)0x0;
      local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
      local_88._16_8_ = 0;
      local_58._M_allocated_capacity = 0;
      local_48 = (ASN1_OCTET_STRING *)0x0;
      bVar8 = (this->super_SSLVersionTest).shed_handshake_config_;
      pcVar7 = (char *)(ulong)bVar8;
      local_88._0_8_ = pcVar1;
      local_68._M_p = (pointer)&local_58;
      local_b8[0] = (internal)
                    ConnectClientAndServer
                              (out_client,(UniquePtr<SSL> *)local_38,
                               (this->super_SSLVersionTest).client_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (this->super_SSLVersionTest).server_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (ClientConfig *)local_98,bVar8);
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      if ((pointer)local_88._0_8_ != pcVar1) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if (local_b8[0] != (internal)0x0) {
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        psVar6 = SSL_get_peer_full_cert_chain
                           ((out_client->_M_t).
                            super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_a8._M_head_impl =
             (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_a0 = (X509 *)local_40._M_head_impl;
        __l_01._M_len = 2;
        __l_01._M_array = &local_a8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_01,
                   (allocator_type *)&local_c0);
        local_b8[0] = (internal)
                      ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
          if (!(bool)local_b8[0]) goto LAB_0018b5a6;
        }
        else {
          operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
          if (((byte)local_b8[0] & 1) == 0) {
LAB_0018b5a6:
            testing::Message::Message((Message *)&local_a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,local_b8,
                       (AssertionResult *)
                       "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), intermediate.get()})"
                       ,"false","true",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1134,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
              operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
            }
            if (local_a8._M_head_impl != (x509_st *)0x0) {
              (*(code *)(local_a8._M_head_impl)->cert_info->serialNumber)();
            }
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        psVar6 = SSL_get_peer_full_cert_chain
                           ((SSL *)*(__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true> *)
                                    local_38);
        local_a8._M_head_impl =
             (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        local_a0 = (X509 *)local_40._M_head_impl;
        __l_02._M_len = 2;
        __l_02._M_array = &local_a8._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_02,
                   (allocator_type *)&local_c0);
        local_b8[0] = (internal)
                      ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
          if (!(bool)local_b8[0]) goto LAB_0018b6d1;
        }
        else {
          operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
          if (((byte)local_b8[0] & 1) == 0) {
LAB_0018b6d1:
            testing::Message::Message((Message *)&local_a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,local_b8,
                       (AssertionResult *)
                       "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), intermediate.get()})"
                       ,"false","true",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1136,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
              operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
            }
            if ((X509 *)local_a8._M_head_impl != (X509 *)0x0) {
              (*(code *)((X509_CINF *)(local_a8._M_head_impl)->cert_info)->serialNumber)();
            }
          }
        }
        if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b0,local_b0);
        }
        iVar4 = SSL_CTX_add1_chain_cert
                          ((this->super_SSLVersionTest).client_ctx_._M_t.
                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                           (this->super_SSLVersionTest).cert_._M_t.
                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
        local_b8[0] = (internal)(iVar4 != 0);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar4 == 0) {
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,local_b8,
                     (AssertionResult *)"SSL_CTX_add1_chain_cert(client_ctx_.get(), cert_.get())",
                     "false","true",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1139,(char *)local_98._0_8_);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
        }
        else {
          iVar4 = SSL_CTX_add1_chain_cert
                            ((this->super_SSLVersionTest).server_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             (this->super_SSLVersionTest).cert_._M_t.
                             super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
          local_b8[0] = (internal)(iVar4 != 0);
          local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar4 == 0) {
            testing::Message::Message((Message *)&local_a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,local_b8,
                       (AssertionResult *)"SSL_CTX_add1_chain_cert(server_ctx_.get(), cert_.get())",
                       "false","true",pcVar7);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x113a,(char *)local_98._0_8_);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
          }
          else {
            local_88._8_8_ = 0;
            local_88._24_8_ = 0;
            sStack_60 = 0;
            local_58._8_8_ = 0;
            local_98._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
            local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
            local_88._16_8_ = 0;
            local_58._M_allocated_capacity = 0;
            local_48 = (ASN1_OCTET_STRING *)0x0;
            bVar8 = (this->super_SSLVersionTest).shed_handshake_config_;
            pcVar7 = (char *)(ulong)bVar8;
            local_88._0_8_ = pcVar1;
            local_68._M_p = (pointer)&local_58;
            local_b8[0] = (internal)
                          ConnectClientAndServer
                                    (out_client,(UniquePtr<SSL> *)local_38,
                                     (this->super_SSLVersionTest).client_ctx_._M_t.
                                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                     (this->super_SSLVersionTest).server_ctx_._M_t.
                                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                     (ClientConfig *)local_98,bVar8);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            ClientConfig::~ClientConfig((ClientConfig *)local_98);
            if (local_b8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,local_b8,(AssertionResult *)"Connect()","false","true",
                         pcVar7);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x113b,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
              goto LAB_0018b553;
            }
            if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b0,local_b0);
            }
            psVar6 = SSL_get_peer_full_cert_chain
                               ((out_client->_M_t).
                                super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            local_a8._M_head_impl =
                 (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_03._M_len = 2;
            __l_03._M_array = &local_a8._M_head_impl;
            local_a0 = (X509 *)local_a8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_03,
                       (allocator_type *)&local_c0);
            local_b8[0] = (internal)
                          ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                             local_98);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
              if (!(bool)local_b8[0]) goto LAB_0018b9fe;
            }
            else {
              operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
              if (((byte)local_b8[0] & 1) == 0) {
LAB_0018b9fe:
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,local_b8,
                           (AssertionResult *)
                           "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), cert_.get()})"
                           ,"false","true",pcVar7);
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x113e,(char *)local_98._0_8_);
                testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
                  operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
                }
                if (local_a8._M_head_impl != (x509_st *)0x0) {
                  (*(code *)(local_a8._M_head_impl)->cert_info->serialNumber)();
                }
              }
            }
            if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b0,local_b0);
            }
            psVar6 = SSL_get_peer_full_cert_chain
                               ((SSL *)*(__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>
                                         *)local_38);
            local_a8._M_head_impl =
                 (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_04._M_len = 2;
            __l_04._M_array = &local_a8._M_head_impl;
            local_a0 = (X509 *)local_a8._M_head_impl;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_04,
                       (allocator_type *)&local_c0);
            local_b8[0] = (internal)
                          ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                             local_98);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
              if (!(bool)local_b8[0]) goto LAB_0018bb21;
            }
            else {
              operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
              if (((byte)local_b8[0] & 1) == 0) {
LAB_0018bb21:
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,local_b8,
                           (AssertionResult *)
                           "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), cert_.get()})"
                           ,"false","true",pcVar7);
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1140,(char *)local_98._0_8_);
                testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                if ((undefined1 *)local_98._0_8_ != local_88) {
                  operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
                }
                if ((X509 *)local_a8._M_head_impl != (X509 *)0x0) {
                  (*(code *)((X509_CINF *)(local_a8._M_head_impl)->cert_info)->serialNumber)();
                }
              }
            }
            if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b0,local_b0);
            }
            SSL_CTX_clear_chain_certs
                      ((this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
            SSL_CTX_clear_chain_certs
                      ((this->super_SSLVersionTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
            SSL_CTX_set_cert_cb((this->super_SSLVersionTest).client_ctx_._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                TestBody::anon_class_1_0_00000001::__invoke,
                                (this->super_SSLVersionTest).cert_._M_t.
                                super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
            SSL_CTX_set_cert_cb((this->super_SSLVersionTest).server_ctx_._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                TestBody::anon_class_1_0_00000001::__invoke,
                                (this->super_SSLVersionTest).cert_._M_t.
                                super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
            local_88._8_8_ = 0;
            local_88._24_8_ = 0;
            sStack_60 = 0;
            local_58._8_8_ = 0;
            local_98._0_8_ = (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
            local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
            local_88._16_8_ = 0;
            local_58._M_allocated_capacity = 0;
            local_48 = (ASN1_OCTET_STRING *)0x0;
            bVar8 = (this->super_SSLVersionTest).shed_handshake_config_;
            pcVar7 = (char *)(ulong)bVar8;
            local_88._0_8_ = pcVar1;
            local_68._M_p = (pointer)&local_58;
            local_b8[0] = (internal)
                          ConnectClientAndServer
                                    (out_client,(UniquePtr<SSL> *)local_38,
                                     (this->super_SSLVersionTest).client_ctx_._M_t.
                                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                     (this->super_SSLVersionTest).server_ctx_._M_t.
                                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                     (ClientConfig *)local_98,bVar8);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            ClientConfig::~ClientConfig((ClientConfig *)local_98);
            if (local_b8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,local_b8,(AssertionResult *)"Connect()","false","true",
                         pcVar7);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x114c,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
            }
            else {
              if (local_b0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_b0,local_b0);
              }
              psVar6 = SSL_get_peer_full_cert_chain
                                 ((out_client->_M_t).
                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              local_a8._M_head_impl =
                   (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_05._M_len = 2;
              __l_05._M_array = &local_a8._M_head_impl;
              local_a0 = (X509 *)local_a8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_05,
                         (allocator_type *)&local_c0);
              local_b8[0] = (internal)
                            ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                               local_98);
              local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((x509_st *)local_98._0_8_ == (x509_st *)0x0) {
                if (!(bool)local_b8[0]) goto LAB_0018bd6a;
              }
              else {
                operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
                if (((byte)local_b8[0] & 1) == 0) {
LAB_0018bd6a:
                  testing::Message::Message((Message *)&local_a8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_98,local_b8,
                             (AssertionResult *)
                             "ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get(), cert_.get()})"
                             ,"false","true",pcVar7);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_c0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x114f,(char *)local_98._0_8_);
                  testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
                  testing::internal::AssertHelper::~AssertHelper(&local_c0);
                  if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
                    operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
                  }
                  if (local_a8._M_head_impl != (x509_st *)0x0) {
                    (*(code *)(local_a8._M_head_impl)->cert_info->serialNumber)();
                  }
                }
              }
              if (local_b0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_b0,local_b0);
              }
              psVar6 = SSL_get_peer_full_cert_chain
                                 ((SSL *)*(__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>
                                           *)local_38);
              local_a8._M_head_impl =
                   (this_00->_M_t).super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_06._M_len = 2;
              __l_06._M_array = &local_a8._M_head_impl;
              local_a0 = (X509 *)local_a8._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98,__l_06,
                         (allocator_type *)&local_c0);
              iVar3 = (internal)
                      ChainsEqual(psVar6,(vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_98);
              local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_b8[0] = iVar3;
              if ((x509_st *)local_98._0_8_ != (x509_st *)0x0) {
                operator_delete((void *)local_98._0_8_,local_88._0_8_ - local_98._0_8_);
              }
              if ((bool)iVar3) goto LAB_0018b156;
              testing::Message::Message((Message *)&local_a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_98,local_b8,
                         (AssertionResult *)
                         "ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get(), cert_.get()})"
                         ,"false","true",pcVar7);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1151,(char *)local_98._0_8_);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
            }
          }
        }
        goto LAB_0018b10f;
      }
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,local_b8,(AssertionResult *)"Connect()","false","true",pcVar7);
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1131,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
    }
LAB_0018b553:
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((x509_st *)local_98._0_8_ != (x509_st *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((X509 *)local_a8._M_head_impl != (X509 *)0x0) {
      (*(code *)((X509_CINF *)(local_a8._M_head_impl)->cert_info)->serialNumber)();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
LAB_0018b156:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_40);
  return;
}

Assistant:

TEST_P(SSLVersionTest, AutoChain) {
  cert_ = GetChainTestCertificate();
  ASSERT_TRUE(cert_);
  key_ = GetChainTestKey();
  ASSERT_TRUE(key_);
  bssl::UniquePtr<X509> intermediate = GetChainTestIntermediate();
  ASSERT_TRUE(intermediate);

  ASSERT_TRUE(UseCertAndKey(client_ctx_.get()));
  ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));

  // Configure both client and server to accept any certificate. Add
  // |intermediate| to the cert store.
  ASSERT_TRUE(X509_STORE_add_cert(SSL_CTX_get_cert_store(client_ctx_.get()),
                                  intermediate.get()));
  ASSERT_TRUE(X509_STORE_add_cert(SSL_CTX_get_cert_store(server_ctx_.get()),
                                  intermediate.get()));
  SSL_CTX_set_verify(client_ctx_.get(),
                     SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT,
                     nullptr);
  SSL_CTX_set_verify(server_ctx_.get(),
                     SSL_VERIFY_PEER | SSL_VERIFY_FAIL_IF_NO_PEER_CERT,
                     nullptr);
  SSL_CTX_set_cert_verify_callback(client_ctx_.get(), VerifySucceed, NULL);
  SSL_CTX_set_cert_verify_callback(server_ctx_.get(), VerifySucceed, NULL);

  // By default, the client and server should each only send the leaf.
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(
      ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()), {cert_.get()}));
  EXPECT_TRUE(
      ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()), {cert_.get()}));

  // If auto-chaining is enabled, then the intermediate is sent.
  SSL_CTX_clear_mode(client_ctx_.get(), SSL_MODE_NO_AUTO_CHAIN);
  SSL_CTX_clear_mode(server_ctx_.get(), SSL_MODE_NO_AUTO_CHAIN);
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), intermediate.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), intermediate.get()}));

  // Auto-chaining does not override explicitly-configured intermediates.
  ASSERT_TRUE(SSL_CTX_add1_chain_cert(client_ctx_.get(), cert_.get()));
  ASSERT_TRUE(SSL_CTX_add1_chain_cert(server_ctx_.get(), cert_.get()));
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), cert_.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), cert_.get()}));

  // Auto-chaining does not override explicitly-configured intermediates that
  // are configured as late as cert_cb. If this fails, something in the
  // handshake is likely auto-chaining too early.
  SSL_CTX_clear_chain_certs(client_ctx_.get());
  SSL_CTX_clear_chain_certs(server_ctx_.get());
  auto install_intermediate = [](SSL *ssl, void *arg) -> int {
    return SSL_add1_chain_cert(ssl, static_cast<X509 *>(arg));
  };
  SSL_CTX_set_cert_cb(client_ctx_.get(), install_intermediate, cert_.get());
  SSL_CTX_set_cert_cb(server_ctx_.get(), install_intermediate, cert_.get());
  ASSERT_TRUE(Connect());

  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(client_.get()),
                          {cert_.get(), cert_.get()}));
  EXPECT_TRUE(ChainsEqual(SSL_get_peer_full_cert_chain(server_.get()),
                          {cert_.get(), cert_.get()}));
}